

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O2

stringc * __thiscall
irr::scene::CXMeshFileLoader::getNextToken(stringc *__return_storage_ptr__,CXMeshFileLoader *this)

{
  undefined1 *puVar1;
  byte character;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  long lVar8;
  uint length;
  int *c;
  char *c_00;
  u32 length_00;
  long lStack_80;
  stringc s;
  string<char> local_50;
  
  s.str._M_dataplus._M_p = (pointer)&s.str.field_2;
  s.str._M_string_length = 0;
  s.str.field_2._M_local_buf[0] = '\0';
  if (this->BinaryFormat != true) {
    findNextNoneWhiteSpace(this);
    pbVar5 = *(byte **)&(this->super_IMeshLoader).field_0x18;
    pbVar7 = (byte *)this->End;
    if (pbVar5 < pbVar7) {
      while (pbVar5 < pbVar7) {
        character = *pbVar5;
        uVar4 = (ulong)character;
        if (uVar4 < 0x3c) {
          if ((0x100003e00U >> (uVar4 & 0x3f) & 1) == 0) {
            if ((0x800100000000000U >> (uVar4 & 0x3f) & 1) == 0) goto LAB_001dcff5;
LAB_001dd018:
            if ((int)s.str._M_string_length == 0) {
              core::string<char>::append(&s,character);
              puVar1 = &(this->super_IMeshLoader).field_0x18;
              *(long *)puVar1 = *(long *)puVar1 + 1;
            }
          }
          break;
        }
LAB_001dcff5:
        if ((character == 0x7d) || (character == 0x7b)) goto LAB_001dd018;
        core::string<char>::append(&s,character);
        pbVar7 = (byte *)this->End;
        pbVar5 = (byte *)(*(long *)&(this->super_IMeshLoader).field_0x18 + 1);
        *(byte **)&(this->super_IMeshLoader).field_0x18 = pbVar5;
      }
    }
switchD_001dcf5b_caseD_4:
    goto LAB_001dd035;
  }
  piVar2 = *(int **)&(this->super_IMeshLoader).field_0x18;
  piVar3 = (int *)this->End;
  if (piVar3 <= piVar2) goto switchD_001dcf5b_caseD_4;
  iVar6 = *piVar2;
  c = (int *)((long)piVar2 + 2);
  *(int **)&(this->super_IMeshLoader).field_0x18 = c;
  switch((short)iVar6) {
  case 1:
    length = 0;
    if (c < piVar3) {
      length = *(uint *)((long)piVar2 + 2);
      c = (int *)((long)piVar2 + 6);
      *(int **)&(this->super_IMeshLoader).field_0x18 = c;
    }
    core::string<char>::string<char>(&local_50,(char *)c,length);
    core::string<char>::operator=(&s,&local_50);
    ::std::__cxx11::string::_M_dispose();
    puVar1 = &(this->super_IMeshLoader).field_0x18;
    *(ulong *)puVar1 = *(long *)puVar1 + (ulong)length;
    goto LAB_001dd035;
  case 2:
    length_00 = 0;
    if (c < piVar3) {
      length_00 = *(u32 *)((long)piVar2 + 2);
      c = (int *)((long)piVar2 + 6);
      *(int **)&(this->super_IMeshLoader).field_0x18 = c;
    }
    core::string<char>::string<char>(&local_50,(char *)c,length_00);
    core::string<char>::operator=(&s,&local_50);
    ::std::__cxx11::string::_M_dispose();
    puVar1 = &(this->super_IMeshLoader).field_0x18;
    *(ulong *)puVar1 = *(long *)puVar1 + (ulong)(length_00 + 2);
LAB_001dd035:
    core::string<char>::string(__return_storage_ptr__,&s);
    goto LAB_001dd232;
  case 3:
    *(undefined2 **)&(this->super_IMeshLoader).field_0x18 = (undefined2 *)((long)piVar2 + 6);
    c_00 = "<integer>";
    break;
  default:
    goto switchD_001dcf5b_caseD_4;
  case 5:
    *(undefined2 **)&(this->super_IMeshLoader).field_0x18 = (undefined2 *)((long)piVar2 + 0x12);
    c_00 = "<guid>";
    break;
  case 6:
    if (c < piVar3) {
      uVar4 = (ulong)(uint)(*c << 2);
      lVar8 = 6;
    }
    else {
      lVar8 = 2;
      uVar4 = 0;
    }
    *(ulong *)&(this->super_IMeshLoader).field_0x18 = (long)piVar2 + lVar8 + uVar4;
    c_00 = "<int_list>";
    break;
  case 7:
    if (c < piVar3) {
      iVar6 = *c;
      lStack_80 = 6;
    }
    else {
      iVar6 = 0;
      lStack_80 = 2;
    }
    *(ulong *)&(this->super_IMeshLoader).field_0x18 =
         (long)piVar2 + (ulong)(uint)(this->FloatSize * iVar6) + lStack_80;
    c_00 = "<flt_list>";
    break;
  case 10:
    c_00 = "{";
    break;
  case 0xb:
    c_00 = "}";
    break;
  case 0xc:
    c_00 = "(";
    break;
  case 0xd:
    c_00 = ")";
    break;
  case 0xe:
    c_00 = "[";
    break;
  case 0xf:
    c_00 = "]";
    break;
  case 0x10:
    c_00 = "<";
    break;
  case 0x11:
    c_00 = ">";
    break;
  case 0x12:
    c_00 = ".";
    break;
  case 0x13:
    c_00 = ",";
    break;
  case 0x14:
    c_00 = ";";
    break;
  case 0x1f:
    c_00 = "template";
    break;
  case 0x28:
    c_00 = "WORD";
    break;
  case 0x29:
    c_00 = "DWORD";
    break;
  case 0x2a:
    c_00 = "FLOAT";
    break;
  case 0x2b:
    c_00 = "DOUBLE";
    break;
  case 0x2c:
    c_00 = "CHAR";
    break;
  case 0x2d:
    c_00 = "UCHAR";
    break;
  case 0x2e:
    c_00 = "SWORD";
    break;
  case 0x2f:
    c_00 = "SDWORD";
    break;
  case 0x30:
    c_00 = "void";
    break;
  case 0x31:
    c_00 = "string";
    break;
  case 0x32:
    c_00 = "unicode";
    break;
  case 0x33:
    c_00 = "cstring";
    break;
  case 0x34:
    c_00 = "array";
  }
  core::string<char>::string<char>(__return_storage_ptr__,c_00);
LAB_001dd232:
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

core::stringc CXMeshFileLoader::getNextToken()
{
	core::stringc s;

	// process binary-formatted file
	if (BinaryFormat) {
		// in binary mode it will only return NAME and STRING token
		// and (correctly) skip over other tokens.

		s16 tok = readBinWord();
		u32 len;

		// standalone tokens
		switch (tok) {
		case 1:
			// name token
			len = readBinDWord();
			s = core::stringc(P, len);
			P += len;
			return s;
		case 2:
			// string token
			len = readBinDWord();
			s = core::stringc(P, len);
			P += (len + 2);
			return s;
		case 3:
			// integer token
			P += 4;
			return "<integer>";
		case 5:
			// GUID token
			P += 16;
			return "<guid>";
		case 6:
			len = readBinDWord();
			P += (len * 4);
			return "<int_list>";
		case 7:
			len = readBinDWord();
			P += (len * FloatSize);
			return "<flt_list>";
		case 0x0a:
			return "{";
		case 0x0b:
			return "}";
		case 0x0c:
			return "(";
		case 0x0d:
			return ")";
		case 0x0e:
			return "[";
		case 0x0f:
			return "]";
		case 0x10:
			return "<";
		case 0x11:
			return ">";
		case 0x12:
			return ".";
		case 0x13:
			return ",";
		case 0x14:
			return ";";
		case 0x1f:
			return "template";
		case 0x28:
			return "WORD";
		case 0x29:
			return "DWORD";
		case 0x2a:
			return "FLOAT";
		case 0x2b:
			return "DOUBLE";
		case 0x2c:
			return "CHAR";
		case 0x2d:
			return "UCHAR";
		case 0x2e:
			return "SWORD";
		case 0x2f:
			return "SDWORD";
		case 0x30:
			return "void";
		case 0x31:
			return "string";
		case 0x32:
			return "unicode";
		case 0x33:
			return "cstring";
		case 0x34:
			return "array";
		}
	}
	// process text-formatted file
	else {
		findNextNoneWhiteSpace();

		if (P >= End)
			return s;

		while ((P < End) && !core::isspace(P[0])) {
			// either keep token delimiters when already holding a token, or return if first valid char
			if (P[0] == ';' || P[0] == '}' || P[0] == '{' || P[0] == ',') {
				if (!s.size()) {
					s.append(P[0]);
					++P;
				}
				break; // stop for delimiter
			}
			s.append(P[0]);
			++P;
		}
	}
	return s;
}